

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureFilteringTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles3::Functional::Texture2DArrayFilteringCase::iterate(Texture2DArrayFilteringCase *this)

{
  size_type *psVar1;
  size_t *psVar2;
  ulong uVar3;
  deUint32 dVar4;
  TestLog *log;
  Texture2DArray *pTVar5;
  RenderContext *context;
  pointer pFVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  bool bVar9;
  int iVar10;
  deUint32 dVar11;
  SamplerType SVar12;
  undefined4 extraout_EAX;
  undefined4 extraout_var;
  RenderTarget *pRVar14;
  undefined8 *puVar15;
  NotSupportedError *this_00;
  byte bVar16;
  char *description;
  qpTestResult testResult;
  ulong uVar17;
  TestContext *pTVar18;
  uint uVar19;
  void *pvVar20;
  pointer pFVar21;
  float fVar22;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  Surface rendered;
  RandomViewport viewport;
  undefined8 *local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  LookupPrecision local_378;
  float local_34c;
  PixelFormat pixelFormat;
  ulong local_338 [3];
  Texture2DArrayView local_320;
  ScopedLogSection section;
  IVec4 colorBits;
  ulong local_2f8 [2];
  LodPrecision local_2e4;
  TextureFormat texFmt;
  undefined1 local_2d0 [76];
  _func_int **pp_Stack_284;
  undefined8 local_27c;
  int aiStack_274 [2];
  int local_26c;
  anon_union_16_3_1194ccdc_for_v local_268;
  undefined8 local_258;
  LodMode local_250;
  int iStack_230;
  int iStack_22c;
  undefined1 local_228 [16];
  float local_218;
  float fStack_214;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined1 local_1f8 [8];
  _func_int **pp_Stack_1f0;
  undefined8 local_1e8;
  int aiStack_1e0 [2];
  int local_1d8;
  anon_union_16_3_1194ccdc_for_v local_1d4 [4];
  ios_base local_188 [8];
  ios_base local_180 [272];
  TextureFormatInfo fmtInfo;
  long lVar13;
  
  iVar10 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar13 = CONCAT44(extraout_var,iVar10);
  pRVar14 = Context::getRenderTarget((this->super_TestCase).m_context);
  dVar11 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p
                       );
  uVar19 = ((uint)this->m_caseNdx >> 0x10 ^ this->m_caseNdx ^ 0x3d) * 9;
  uVar19 = (uVar19 >> 4 ^ uVar19) * 0x27d4eb2d;
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&viewport,pRVar14,0x40,0x40,uVar19 >> 0xf ^ dVar11 ^ uVar19);
  iVar10 = this->m_caseNdx;
  pFVar21 = (this->m_cases).
            super__Vector_base<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase>_>
            ._M_impl.super__Vector_impl_data._M_start;
  texFmt = ((pFVar21[iVar10].texture)->m_refTexture).super_TextureLevelPyramid.m_format;
  tcu::getTextureFormatInfo(&fmtInfo,&texFmt);
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_3a8 = &local_398;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"Test","");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
  std::ostream::operator<<(local_1f8,this->m_caseNdx);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f8);
  std::ios_base::~ios_base(local_188);
  uVar3 = CONCAT44(local_378.uvwBits.m_data[0],local_378.coordBits.m_data[2]) + uStack_3a0;
  uVar17 = 0xf;
  if (local_3a8 != &local_398) {
    uVar17 = local_398;
  }
  if (uVar17 < uVar3) {
    uVar17 = 0xf;
    if ((int *)local_378.coordBits.m_data._0_8_ != local_378.uvwBits.m_data + 1) {
      uVar17 = CONCAT44(local_378.uvwBits.m_data[2],local_378.uvwBits.m_data[1]);
    }
    if (uVar17 < uVar3) goto LAB_011247c0;
    puVar15 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_378,0,(char *)0x0,(ulong)local_3a8);
  }
  else {
LAB_011247c0:
    puVar15 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_3a8,local_378.coordBits.m_data._0_8_);
  }
  local_2d0._0_8_ = local_2d0 + 0x10;
  psVar1 = puVar15 + 2;
  if ((size_type *)*puVar15 == psVar1) {
    local_2d0._16_8_ = *psVar1;
    local_2d0._24_8_ = puVar15[3];
  }
  else {
    local_2d0._16_8_ = *psVar1;
    local_2d0._0_8_ = (size_type *)*puVar15;
  }
  local_2d0._8_8_ = puVar15[1];
  *puVar15 = psVar1;
  puVar15[1] = 0;
  *(undefined1 *)psVar1 = 0;
  pixelFormat._0_8_ = local_338;
  std::__cxx11::string::_M_construct<char_const*>((string *)&pixelFormat,"Test ","");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
  std::ostream::operator<<(local_1f8,this->m_caseNdx);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f8);
  std::ios_base::~ios_base(local_188);
  uVar3 = CONCAT44(colorBits.m_data[3],colorBits.m_data[2]) + pixelFormat._8_8_;
  uVar17 = 0xf;
  if ((ulong *)pixelFormat._0_8_ != local_338) {
    uVar17 = local_338[0];
  }
  if (uVar17 < uVar3) {
    uVar17 = 0xf;
    if ((ulong *)CONCAT44(colorBits.m_data[1],colorBits.m_data[0]) != local_2f8) {
      uVar17 = local_2f8[0];
    }
    if (uVar17 < uVar3) goto LAB_01124904;
    puVar15 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&colorBits,0,(char *)0x0,pixelFormat._0_8_);
  }
  else {
LAB_01124904:
    puVar15 = (undefined8 *)
              std::__cxx11::string::_M_append
                        ((char *)&pixelFormat,CONCAT44(colorBits.m_data[1],colorBits.m_data[0]));
  }
  rendered._0_8_ = &rendered.m_pixels.m_cap;
  psVar2 = puVar15 + 2;
  if ((size_t *)*puVar15 == psVar2) {
    rendered.m_pixels.m_cap = *psVar2;
  }
  else {
    rendered.m_pixels.m_cap = *psVar2;
    rendered._0_8_ = (size_t *)*puVar15;
  }
  rendered.m_pixels.m_ptr = (void *)puVar15[1];
  *puVar15 = psVar2;
  puVar15[1] = 0;
  *(undefined1 *)psVar2 = 0;
  tcu::ScopedLogSection::ScopedLogSection(&section,log,(string *)local_2d0,(string *)&rendered);
  if ((size_t *)rendered._0_8_ != &rendered.m_pixels.m_cap) {
    operator_delete((void *)rendered._0_8_,rendered.m_pixels.m_cap + 1);
  }
  if ((ulong *)CONCAT44(colorBits.m_data[1],colorBits.m_data[0]) != local_2f8) {
    operator_delete((ulong *)CONCAT44(colorBits.m_data[1],colorBits.m_data[0]),local_2f8[0] + 1);
  }
  if ((ulong *)pixelFormat._0_8_ != local_338) {
    operator_delete((void *)pixelFormat._0_8_,local_338[0] + 1);
  }
  if ((undefined1 *)local_2d0._0_8_ != local_2d0 + 0x10) {
    operator_delete((void *)local_2d0._0_8_,local_2d0._16_8_ + 1);
  }
  if ((int *)local_378.coordBits.m_data._0_8_ != local_378.uvwBits.m_data + 1) {
    operator_delete((void *)local_378.coordBits.m_data._0_8_,
                    CONCAT44(local_378.uvwBits.m_data[2],local_378.uvwBits.m_data[1]) + 1);
  }
  if (local_3a8 != &local_398) {
    operator_delete(local_3a8,local_398 + 1);
  }
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)local_2d0,TEXTURETYPE_2D_ARRAY);
  tcu::Surface::Surface(&rendered,viewport.width,viewport.height);
  local_388 = 0.0;
  fStack_384 = 0.0;
  fStack_380 = 0.0;
  fStack_37c = 0.0;
  local_398 = 0;
  uStack_390 = 0;
  local_3a8 = (undefined8 *)0x0;
  uStack_3a0 = 0;
  if ((viewport.width < 0x40) || (viewport.height < 0x40)) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Too small render target",::glcts::fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureFilteringTests.cpp"
               ,0x347);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  glu::mapGLSampler((Sampler *)local_1f8,this->m_wrapS,this->m_wrapT,this->m_wrapT,this->m_minFilter
                    ,this->m_magFilter);
  local_26c = local_1d8;
  local_27c = local_1e8;
  aiStack_274[0] = aiStack_1e0[0];
  aiStack_274[1] = aiStack_1e0[1];
  local_2d0._68_8_ = local_1f8;
  pp_Stack_284 = pp_Stack_1f0;
  local_268._0_8_ = local_1d4[0]._0_8_;
  local_268._8_8_ = local_1d4[0]._8_8_;
  local_258 = local_1d4[1]._0_8_;
  SVar12 = glu::TextureTestUtil::getSamplerType(texFmt);
  local_2d0._4_4_ = SVar12;
  local_250 = LODMODE_EXACT;
  local_2d0._52_4_ = fmtInfo.lookupBias.m_data[0];
  local_2d0._56_4_ = fmtInfo.lookupBias.m_data[1];
  local_2d0._60_4_ = fmtInfo.lookupBias.m_data[2];
  local_2d0._64_4_ = fmtInfo.lookupBias.m_data[3];
  local_2d0._36_4_ = fmtInfo.lookupScale.m_data[0];
  local_2d0._40_4_ = fmtInfo.lookupScale.m_data[1];
  local_2d0._44_4_ = fmtInfo.lookupScale.m_data[2];
  local_2d0._48_4_ = fmtInfo.lookupScale.m_data[3];
  local_1f8 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1f0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pp_Stack_1f0,"Approximate lod per axis = ",0x1b);
  pFVar21 = pFVar21 + iVar10;
  tcu::operator<<((ostream *)&pp_Stack_1f0,&pFVar21->lod);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1f0,", offset = ",0xb);
  tcu::operator<<((ostream *)&pp_Stack_1f0,&pFVar21->offset);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1f0);
  std::ios_base::~ios_base(local_180);
  local_34c = (pFVar21->lod).m_data[1] * 0.6931472;
  local_218 = expf((pFVar21->lod).m_data[0] * 0.6931472);
  pTVar5 = this->m_gradientTex;
  local_208 = *(undefined8 **)(pFVar21->offset).m_data;
  uStack_200 = 0;
  iStack_230 = viewport.width;
  iStack_22c = viewport.height;
  local_228 = ZEXT416((uint)(pTVar5->m_refTexture).m_width);
  fStack_214 = extraout_XMM0_Db;
  fVar22 = expf(local_34c);
  auVar24._0_4_ = local_218 * (float)iStack_230;
  auVar24._4_4_ = fVar22 * (float)viewport.height;
  auVar24._8_4_ = fStack_214 * (float)iStack_230;
  auVar24._12_4_ = extraout_XMM0_Db_00 * (float)iStack_22c;
  auVar25._0_4_ = (float)(int)local_228._0_4_;
  auVar25._4_4_ = (float)(pTVar5->m_refTexture).m_height;
  auVar25._8_4_ = (float)(int)local_228._4_4_;
  auVar25._12_4_ = 0;
  auVar25 = divps(auVar24,auVar25);
  fVar22 = (pFVar21->layerRange).m_data[0];
  fStack_37c = (pFVar21->layerRange).m_data[1];
  local_3a8 = local_208;
  local_388 = fVar22 * 0.5 + fStack_37c * 0.5;
  uStack_3a0 = CONCAT44((float)local_208,fVar22);
  fStack_384 = auVar25._0_4_ + (float)local_208;
  fStack_380 = auVar25._4_4_ + local_208._4_4_;
  local_398 = CONCAT44(local_388,fStack_380);
  uStack_390 = CONCAT44(local_208._4_4_,fStack_384);
  (**(code **)(lVar13 + 0xb8))(0x8c1a,pFVar21->texture->m_glTexture);
  (**(code **)(lVar13 + 0x1360))(0x8c1a,0x2801,this->m_minFilter);
  (**(code **)(lVar13 + 0x1360))(0x8c1a,0x2800,this->m_magFilter);
  (**(code **)(lVar13 + 0x1360))(0x8c1a,0x2802,this->m_wrapS);
  (**(code **)(lVar13 + 0x1360))(0x8c1a,0x2803,this->m_wrapT);
  (**(code **)(lVar13 + 0x1a00))(viewport.x,viewport.y,viewport.width,viewport.height);
  deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
            (&this->m_renderer,0,(float *)&local_3a8,(RenderParams *)local_2d0);
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  local_378.coordBits.m_data[0] = 8;
  local_378.coordBits.m_data[1] = 3;
  pvVar20 = (void *)rendered.m_pixels.m_cap;
  if (rendered.m_pixels.m_cap != 0) {
    pvVar20 = rendered.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1f8,(TextureFormat *)&local_378,rendered.m_width,
             rendered.m_height,1,pvVar20);
  glu::readPixels(context,viewport.x,viewport.y,(PixelBufferAccess *)local_1f8);
  dVar11 = this->m_minFilter;
  dVar4 = this->m_magFilter;
  pRVar14 = Context::getRenderTarget((this->super_TestCase).m_context);
  uVar19 = (dVar4 == 0x2600 && dVar11 == 0x2600) | 0xfffffffe;
  pixelFormat.redBits = (pRVar14->m_pixelFormat).redBits;
  pixelFormat.greenBits = (pRVar14->m_pixelFormat).greenBits;
  pixelFormat.blueBits = (pRVar14->m_pixelFormat).blueBits;
  pixelFormat.alphaBits = (pRVar14->m_pixelFormat).alphaBits;
  colorBits.m_data[0] =
       -(uint)(0 < (int)(uVar19 + pixelFormat.redBits)) & uVar19 + pixelFormat.redBits;
  colorBits.m_data[1] =
       -(uint)(0 < (int)(uVar19 + pixelFormat.greenBits)) & uVar19 + pixelFormat.greenBits;
  colorBits.m_data[2] =
       -(uint)(0 < (int)(uVar19 + pixelFormat.blueBits)) & uVar19 + pixelFormat.blueBits;
  colorBits.m_data[3] =
       -(uint)(0 < (int)(uVar19 + pixelFormat.alphaBits)) & uVar19 + pixelFormat.alphaBits;
  local_2e4.rule = RULE_OPENGL;
  local_2e4.derivateBits = 0x12;
  local_378.coordBits.m_data[0] = 0x16;
  local_378.coordBits.m_data[1] = 0x16;
  local_378.coordBits.m_data[2] = 0x16;
  local_378.uvwBits.m_data[0] = 0x10;
  local_378.uvwBits.m_data[1] = 0x10;
  local_378.uvwBits.m_data[2] = 0x10;
  local_378.colorThreshold.m_data = (float  [4])ZEXT816(0);
  local_378.colorMask.m_data[0] = true;
  local_378.colorMask.m_data[1] = true;
  local_378.colorMask.m_data[2] = true;
  local_378.colorMask.m_data[3] = true;
  local_2e4.lodBits = 6;
  tcu::computeFixedPointThreshold((tcu *)local_1f8,&colorBits);
  auVar8._8_8_ = pp_Stack_1f0;
  auVar8._0_8_ = local_1f8;
  auVar7._8_8_ = local_2d0._44_8_;
  auVar7._0_8_ = local_2d0._36_8_;
  local_378.colorThreshold.m_data = (float  [4])divps(auVar8,auVar7);
  local_378.coordBits.m_data[0] = 0x14;
  local_378.coordBits.m_data[1] = 0x14;
  local_378.coordBits.m_data[2] = 0x14;
  local_378.uvwBits.m_data[0] = 7;
  local_378.uvwBits.m_data[1] = 7;
  local_378.uvwBits.m_data[2] = 0;
  auVar23._0_4_ = -(uint)(0 < pixelFormat.redBits);
  auVar23._4_4_ = -(uint)(0 < pixelFormat.greenBits);
  auVar23._8_4_ = -(uint)(0 < pixelFormat.blueBits);
  auVar23._12_4_ = -(uint)(0 < pixelFormat.alphaBits);
  uVar19 = movmskps(extraout_EAX,auVar23);
  bVar16 = (byte)uVar19;
  local_378.colorMask.m_data =
       (bool  [4])
       (uVar19 & 1 | (uint)((bVar16 & 2) >> 1) << 8 | (uint)((bVar16 & 4) >> 2) << 0x10 |
       (uint)(bVar16 >> 3) << 0x18);
  pTVar18 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
  local_320.m_numLevels = 8;
  local_320._4_4_ = 3;
  pvVar20 = (void *)rendered.m_pixels.m_cap;
  if (rendered.m_pixels.m_cap != 0) {
    pvVar20 = rendered.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1f8,(TextureFormat *)&local_320,rendered.m_width,
             rendered.m_height,1,pvVar20);
  local_320.m_levels = (pFVar21->texture->m_refTexture).m_view.m_levels;
  local_320.m_numLevels = (pFVar21->texture->m_refTexture).m_view.m_numLevels;
  bVar9 = glu::TextureTestUtil::verifyTextureResult
                    (pTVar18,(ConstPixelBufferAccess *)local_1f8,&local_320,(float *)&local_3a8,
                     (ReferenceParams *)local_2d0,&local_378,&local_2e4,&pixelFormat);
  if (!bVar9) {
    local_2e4.lodBits = 4;
    local_378.uvwBits.m_data[0] = 4;
    local_378.uvwBits.m_data[1] = 4;
    local_378.uvwBits.m_data[2] = 0;
    local_1f8 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1f0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pp_Stack_1f0,
               "Warning: Verification against high precision requirements failed, trying with lower requirements."
               ,0x61);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1f0);
    std::ios_base::~ios_base(local_180);
    pTVar18 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    local_320.m_numLevels = 8;
    local_320._4_4_ = 3;
    pvVar20 = (void *)rendered.m_pixels.m_cap;
    if (rendered.m_pixels.m_cap != 0) {
      pvVar20 = rendered.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_1f8,(TextureFormat *)&local_320,rendered.m_width,
               rendered.m_height,1,pvVar20);
    local_320.m_levels = (pFVar21->texture->m_refTexture).m_view.m_levels;
    local_320.m_numLevels = (pFVar21->texture->m_refTexture).m_view.m_numLevels;
    bVar9 = glu::TextureTestUtil::verifyTextureResult
                      (pTVar18,(ConstPixelBufferAccess *)local_1f8,&local_320,(float *)&local_3a8,
                       (ReferenceParams *)local_2d0,&local_378,&local_2e4,&pixelFormat);
    if (bVar9) {
      pTVar18 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      if (pTVar18->m_testResult != QP_TEST_RESULT_PASS) goto LAB_01125138;
      description = "Low-quality filtering result";
      testResult = QP_TEST_RESULT_QUALITY_WARNING;
    }
    else {
      local_1f8 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1f0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&pp_Stack_1f0,
                 "ERROR: Verification against low precision requirements failed, failing test case."
                 ,0x51);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1f0);
      std::ios_base::~ios_base(local_180);
      pTVar18 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      description = "Image verification failed";
      testResult = QP_TEST_RESULT_FAIL;
    }
    tcu::TestContext::setTestResult(pTVar18,testResult,description);
  }
LAB_01125138:
  iVar10 = this->m_caseNdx + 1;
  this->m_caseNdx = iVar10;
  pFVar21 = (this->m_cases).
            super__Vector_base<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pFVar6 = (this->m_cases).
           super__Vector_base<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  tcu::Surface::~Surface(&rendered);
  tcu::TestLog::endSection(section.m_log);
  return (IterateResult)(iVar10 < (int)((ulong)((long)pFVar6 - (long)pFVar21) >> 5));
}

Assistant:

Texture2DArrayFilteringCase::IterateResult Texture2DArrayFilteringCase::iterate (void)
{
	const glw::Functions&			gl			= m_context.getRenderContext().getFunctions();
	const RandomViewport			viewport	(m_context.getRenderTarget(), TEX3D_VIEWPORT_WIDTH, TEX3D_VIEWPORT_HEIGHT, deStringHash(getName()) ^ deInt32Hash(m_caseNdx));
	const FilterCase&				curCase		= m_cases[m_caseNdx];
	const tcu::TextureFormat		texFmt		= curCase.texture->getRefTexture().getFormat();
	const tcu::TextureFormatInfo	fmtInfo		= tcu::getTextureFormatInfo(texFmt);
	const tcu::ScopedLogSection		section		(m_testCtx.getLog(), string("Test") + de::toString(m_caseNdx), string("Test ") + de::toString(m_caseNdx));
	ReferenceParams					refParams	(TEXTURETYPE_2D_ARRAY);
	tcu::Surface					rendered	(viewport.width, viewport.height);
	tcu::Vec3						texCoord[4];

	if (viewport.width < TEX3D_MIN_VIEWPORT_WIDTH || viewport.height < TEX3D_MIN_VIEWPORT_HEIGHT)
		throw tcu::NotSupportedError("Too small render target", "", __FILE__, __LINE__);

	// Setup params for reference.
	refParams.sampler		= glu::mapGLSampler(m_wrapS, m_wrapT, m_wrapT, m_minFilter, m_magFilter);
	refParams.samplerType	= getSamplerType(texFmt);
	refParams.lodMode		= LODMODE_EXACT;
	refParams.colorBias		= fmtInfo.lookupBias;
	refParams.colorScale	= fmtInfo.lookupScale;

	// Compute texture coordinates.
	m_testCtx.getLog() << TestLog::Message << "Approximate lod per axis = " << curCase.lod << ", offset = " << curCase.offset << TestLog::EndMessage;

	{
		const float	lodX	= curCase.lod.x();
		const float	lodY	= curCase.lod.y();
		const float	oX		= curCase.offset.x();
		const float	oY		= curCase.offset.y();
		const float	sX		= deFloatExp2(lodX)*float(viewport.width)	/ float(m_gradientTex->getRefTexture().getWidth());
		const float	sY		= deFloatExp2(lodY)*float(viewport.height)	/ float(m_gradientTex->getRefTexture().getHeight());
		const float	l0		= curCase.layerRange.x();
		const float	l1		= curCase.layerRange.y();

		texCoord[0] = tcu::Vec3(oX,		oY,		l0);
		texCoord[1] = tcu::Vec3(oX,		oY+sY,	l0*0.5f + l1*0.5f);
		texCoord[2] = tcu::Vec3(oX+sX,	oY,		l0*0.5f + l1*0.5f);
		texCoord[3] = tcu::Vec3(oX+sX,	oY+sY,	l1);
	}

	gl.bindTexture	(GL_TEXTURE_2D_ARRAY, curCase.texture->getGLTexture());
	gl.texParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MIN_FILTER,	m_minFilter);
	gl.texParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MAG_FILTER,	m_magFilter);
	gl.texParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_WRAP_S,		m_wrapS);
	gl.texParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_WRAP_T,		m_wrapT);

	gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);
	m_renderer.renderQuad(0, (const float*)&texCoord[0], refParams);
	glu::readPixels(m_context.getRenderContext(), viewport.x, viewport.y, rendered.getAccess());

	{
		const bool				isNearestOnly	= m_minFilter == GL_NEAREST && m_magFilter == GL_NEAREST;
		const tcu::PixelFormat	pixelFormat		= m_context.getRenderTarget().getPixelFormat();
		const tcu::IVec4		colorBits		= max(getBitsVec(pixelFormat) - (isNearestOnly ? 1 : 2), tcu::IVec4(0)); // 1 inaccurate bit if nearest only, 2 otherwise
		tcu::LodPrecision		lodPrecision	(tcu::LodPrecision::RULE_OPENGL);
		tcu::LookupPrecision	lookupPrecision;

		lodPrecision.derivateBits		= 18;
		lodPrecision.lodBits			= 6;
		lookupPrecision.colorThreshold	= tcu::computeFixedPointThreshold(colorBits) / refParams.colorScale;
		lookupPrecision.coordBits		= tcu::IVec3(20,20,20);
		lookupPrecision.uvwBits			= tcu::IVec3(7,7,0);
		lookupPrecision.colorMask		= getCompareMask(pixelFormat);

		const bool isHighQuality = verifyTextureResult(m_testCtx, rendered.getAccess(), curCase.texture->getRefTexture(),
													   (const float*)&texCoord[0], refParams, lookupPrecision, lodPrecision, pixelFormat);

		if (!isHighQuality)
		{
			// Evaluate against lower precision requirements.
			lodPrecision.lodBits	= 4;
			lookupPrecision.uvwBits	= tcu::IVec3(4,4,0);

			m_testCtx.getLog() << TestLog::Message << "Warning: Verification against high precision requirements failed, trying with lower requirements." << TestLog::EndMessage;

			const bool isOk = verifyTextureResult(m_testCtx, rendered.getAccess(), curCase.texture->getRefTexture(),
												  (const float*)&texCoord[0], refParams, lookupPrecision, lodPrecision, pixelFormat);

			if (!isOk)
			{
				m_testCtx.getLog() << TestLog::Message << "ERROR: Verification against low precision requirements failed, failing test case." << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");
			}
			else if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
				m_testCtx.setTestResult(QP_TEST_RESULT_QUALITY_WARNING, "Low-quality filtering result");
		}
	}

	m_caseNdx += 1;
	return m_caseNdx < (int)m_cases.size() ? CONTINUE : STOP;
}